

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O3

void __thiscall ProtocolARP::SendRequest(ProtocolARP *this,uint8_t *targetIP)

{
  uint16_t *puVar1;
  uint8_t *puVar2;
  InterfaceMAC *pIVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  undefined4 extraout_var_00;
  uint8_t *value;
  undefined4 extraout_var_01;
  
  DataBuffer::Initialize(&this->ARPRequest,this->MAC);
  iVar4 = (*this->MAC->_vptr_InterfaceMAC[4])();
  (this->ARPRequest).Packet = (this->ARPRequest).Packet + CONCAT44(extraout_var,iVar4);
  iVar4 = (*this->MAC->_vptr_InterfaceMAC[4])();
  puVar1 = &(this->ARPRequest).Remainder;
  *puVar1 = *puVar1 - (short)iVar4;
  (this->ARPRequest).Disposable = false;
  sVar5 = Pack16((this->ARPRequest).Packet,0,1);
  sVar5 = Pack16((this->ARPRequest).Packet,sVar5,0x800);
  sVar5 = Pack8((this->ARPRequest).Packet,sVar5,'\x06');
  sVar5 = Pack8((this->ARPRequest).Packet,sVar5,'\x04');
  sVar5 = Pack16((this->ARPRequest).Packet,sVar5,1);
  puVar2 = (this->ARPRequest).Packet;
  iVar4 = (*this->MAC->_vptr_InterfaceMAC[5])();
  sVar5 = PackBytes(puVar2,sVar5,(uint8_t *)CONCAT44(extraout_var_00,iVar4),6);
  puVar2 = (this->ARPRequest).Packet;
  value = ProtocolIPv4::GetUnicastAddress(this->IP);
  sVar5 = PackBytes(puVar2,sVar5,value,4);
  sVar5 = PackFill((this->ARPRequest).Packet,sVar5,'\0',6);
  sVar5 = PackBytes((this->ARPRequest).Packet,sVar5,targetIP,4);
  (this->ARPRequest).Length = (uint16_t)sVar5;
  pIVar3 = this->MAC;
  iVar4 = (*pIVar3->_vptr_InterfaceMAC[6])(pIVar3);
  (*pIVar3->_vptr_InterfaceMAC[10])
            (pIVar3,this,CONCAT44(extraout_var_01,iVar4),0x806,pIVar3->_vptr_InterfaceMAC[10]);
  return;
}

Assistant:

void ProtocolARP::SendRequest(const uint8_t* targetIP)
{
    ARPRequest.Initialize(&MAC);

    // This is normally done by the mac layer
    // but this buffer is reserved by arp and not allocated from the mac
    ARPRequest.Packet += MAC.HeaderSize();
    ARPRequest.Remainder -= MAC.HeaderSize();

    ARPRequest.Disposable = false;

    size_t offset = 0;
    offset = Pack16(ARPRequest.Packet, offset, 0x0001); // Hardware Type
    offset = Pack16(ARPRequest.Packet, offset, 0x0800); // Protocol Type
    offset = Pack8(ARPRequest.Packet, offset, 6);       // Hardware Size
    offset = Pack8(ARPRequest.Packet, offset, 4);       // Protocol Size
    offset = Pack16(ARPRequest.Packet, offset, 0x0001); // Op

    // Sender's Hardware Address
    offset = PackBytes(ARPRequest.Packet, offset, MAC.GetUnicastAddress(), 6);

    // Sender's Protocol Address
    offset = PackBytes(ARPRequest.Packet, offset, IP.GetUnicastAddress(), 4);

    // Target's Hardware Address
    offset = PackFill(ARPRequest.Packet, offset, 0, 6);

    // Target's Protocol Address
    ARPRequest.Length = PackBytes(ARPRequest.Packet, offset, targetIP, 4);

    MAC.Transmit(&ARPRequest, MAC.GetBroadcastAddress(), 0x0806);
}